

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_geometric.h
# Opt level: O1

Matrix3x4 * __thiscall
Matrix3x4::operator*(Matrix3x4 *__return_storage_ptr__,Matrix3x4 *this,Matrix3x4 *other)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  fVar1 = this->m[0][0];
  fVar2 = this->m[0][1];
  fVar3 = other->m[0][0];
  fVar4 = other->m[1][0];
  fVar5 = this->m[0][2];
  fVar6 = other->m[2][0];
  __return_storage_ptr__->m[0][0] = fVar6 * fVar5 + fVar4 * fVar2 + fVar3 * fVar1;
  fVar7 = other->m[0][1];
  fVar8 = other->m[1][1];
  fVar9 = other->m[2][1];
  __return_storage_ptr__->m[0][1] = fVar9 * fVar5 + fVar8 * fVar2 + fVar7 * fVar1;
  fVar10 = other->m[0][2];
  fVar11 = other->m[1][2];
  fVar12 = other->m[2][2];
  __return_storage_ptr__->m[0][2] = fVar12 * fVar5 + fVar11 * fVar2 + fVar10 * fVar1;
  fVar13 = other->m[0][3];
  fVar14 = other->m[1][3];
  fVar15 = other->m[2][3];
  __return_storage_ptr__->m[0][3] = fVar5 * fVar15 + fVar2 * fVar14 + fVar1 * fVar13 + this->m[0][3]
  ;
  fVar1 = this->m[1][0];
  fVar2 = this->m[1][1];
  fVar5 = this->m[1][2];
  __return_storage_ptr__->m[1][0] = fVar5 * fVar6 + fVar2 * fVar4 + fVar1 * fVar3;
  __return_storage_ptr__->m[1][1] = fVar5 * fVar9 + fVar2 * fVar8 + fVar1 * fVar7;
  __return_storage_ptr__->m[1][2] = fVar5 * fVar12 + fVar2 * fVar11 + fVar1 * fVar10;
  __return_storage_ptr__->m[1][3] = fVar5 * fVar15 + fVar2 * fVar14 + fVar1 * fVar13 + this->m[1][3]
  ;
  fVar1 = this->m[2][0];
  fVar2 = this->m[2][1];
  fVar5 = this->m[2][2];
  __return_storage_ptr__->m[2][0] = fVar6 * fVar5 + fVar4 * fVar2 + fVar3 * fVar1;
  __return_storage_ptr__->m[2][1] = fVar9 * fVar5 + fVar8 * fVar2 + fVar7 * fVar1;
  __return_storage_ptr__->m[2][2] = fVar12 * fVar5 + fVar11 * fVar2 + fVar10 * fVar1;
  __return_storage_ptr__->m[2][3] = fVar5 * fVar15 + fVar2 * fVar14 + fVar1 * fVar13 + this->m[2][3]
  ;
  return __return_storage_ptr__;
}

Assistant:

Matrix3x4 operator *(const Matrix3x4 &other)
	{
		Matrix3x4 result;

		result.m[0][0] = m[0][0]*other.m[0][0] + m[0][1]*other.m[1][0] + m[0][2]*other.m[2][0];
		result.m[0][1] = m[0][0]*other.m[0][1] + m[0][1]*other.m[1][1] + m[0][2]*other.m[2][1];
		result.m[0][2] = m[0][0]*other.m[0][2] + m[0][1]*other.m[1][2] + m[0][2]*other.m[2][2];
		result.m[0][3] = m[0][0]*other.m[0][3] + m[0][1]*other.m[1][3] + m[0][2]*other.m[2][3] + m[0][3];

		result.m[1][0] = m[1][0]*other.m[0][0] + m[1][1]*other.m[1][0] + m[1][2]*other.m[2][0];
		result.m[1][1] = m[1][0]*other.m[0][1] + m[1][1]*other.m[1][1] + m[1][2]*other.m[2][1];
		result.m[1][2] = m[1][0]*other.m[0][2] + m[1][1]*other.m[1][2] + m[1][2]*other.m[2][2];
		result.m[1][3] = m[1][0]*other.m[0][3] + m[1][1]*other.m[1][3] + m[1][2]*other.m[2][3] + m[1][3];

		result.m[2][0] = m[2][0]*other.m[0][0] + m[2][1]*other.m[1][0] + m[2][2]*other.m[2][0];
		result.m[2][1] = m[2][0]*other.m[0][1] + m[2][1]*other.m[1][1] + m[2][2]*other.m[2][1];
		result.m[2][2] = m[2][0]*other.m[0][2] + m[2][1]*other.m[1][2] + m[2][2]*other.m[2][2];
		result.m[2][3] = m[2][0]*other.m[0][3] + m[2][1]*other.m[1][3] + m[2][2]*other.m[2][3] + m[2][3];

		return result;
	}